

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::val::ValidationState_t::TracePointer(ValidationState_t *this,Instruction *inst)

{
  uint uVar1;
  
  while ((uVar1 = (inst->inst_).opcode - 0x41, uVar1 < 0x13 &&
         ((0x40027U >> (uVar1 & 0x1f) & 1) != 0))) {
    uVar1 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    inst = FindDef(this,uVar1);
  }
  return inst;
}

Assistant:

const Instruction* ValidationState_t::TracePointer(
    const Instruction* inst) const {
  auto base_ptr = inst;
  while (base_ptr->opcode() == spv::Op::OpAccessChain ||
         base_ptr->opcode() == spv::Op::OpInBoundsAccessChain ||
         base_ptr->opcode() == spv::Op::OpPtrAccessChain ||
         base_ptr->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
         base_ptr->opcode() == spv::Op::OpCopyObject) {
    base_ptr = FindDef(base_ptr->GetOperandAs<uint32_t>(2u));
  }
  return base_ptr;
}